

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

Function * __thiscall luna::GC::NewFunction(GC *this,GCGeneration gen)

{
  Function *this_00;
  
  this_00 = (Function *)operator_new(200);
  Function::Function(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x20;
  SetObjectGen(this,(GCObject *)this_00,gen);
  return this_00;
}

Assistant:

Function * GC::NewFunction(GCGeneration gen)
    {
        auto f = new Function;
        f->gc_obj_type_ = GCObjectType_Function;
        SetObjectGen(f, gen);
        return f;
    }